

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

int __thiscall QPDFObjectHandle::getArrayNItems(QPDFObjectHandle *this)

{
  int unaff_EBP;
  Array array;
  allocator<char> local_39;
  string local_38;
  
  as_array((Array *)&local_38,this,strict);
  if (local_38._M_dataplus._M_p != (pointer)0x0) {
    unaff_EBP = ::qpdf::Array::size((Array *)&local_38);
  }
  ::qpdf::Array::~Array((Array *)&local_38);
  if (local_38._M_dataplus._M_p == (pointer)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"treating as empty",&local_39);
    typeWarning(this,"array",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    unaff_EBP = 0;
  }
  return unaff_EBP;
}

Assistant:

int
QPDFObjectHandle::getArrayNItems() const
{
    if (auto array = as_array(strict)) {
        return array.size();
    }
    typeWarning("array", "treating as empty");
    QTC::TC("qpdf", "QPDFObjectHandle array treating as empty");
    return 0;
}